

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall
CLParam<int>::CLParam(CLParam<int> *this,string *param_name,string *info,int default_val)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  string *psVar4;
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_name_split;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_50 [52];
  undefined4 local_1c;
  string *local_18;
  
  *(undefined ***)in_RDI = &PTR__CLParam_0013eca8;
  this_00 = (string *)(in_RDI + 8);
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(this_00,in_RSI);
  in_RDI[0x28] = (string)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 0x30),local_18);
  *(undefined4 *)(in_RDI + 0x50) = local_1c;
  *(undefined4 *)(in_RDI + 0x54) = local_1c;
  in_RDI[0x58] = (string)0x0;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  CLOptionsHelper::split(in_RDI,(char)((ulong)this_00 >> 0x38));
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_88);
  if (sVar2 == 2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_88,0);
    psVar4 = (string *)std::__cxx11::string::operator[]((ulong)pvVar3);
    in_RDI[0x28] = *psVar4;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_88,1);
    std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)pvVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return;
}

Assistant:

CLParam<T>(const std::string& param_name,
               const std::string& info,
               T default_val) :
        parameter_name(param_name), description(info),
        value(default_val), default_value(default_val),
        is_set(false)
    {
        if (description.empty()) description="No description for " + parameter_name + ". I guess you're on your own.";
        std::vector<std::string> param_name_split = CLOptionsHelper::split(param_name, ',') ;
        if (param_name_split.size() == 2) {
            parameter_name_short = param_name_split[0][0] ;
            parameter_name = param_name_split[1] ;
        }
    }